

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O3

bool cmSystemTools::IsOn(char *val)

{
  byte bVar1;
  char cVar2;
  ulong uVar3;
  
  if (val == (char *)0x0) {
    return false;
  }
  bVar1 = *val;
  uVar3 = (ulong)(bVar1 - 0x4f);
  if (0x2a < bVar1 - 0x4f) {
LAB_001bacb9:
    if (bVar1 != 0x31) {
      return false;
    }
    cVar2 = val[1];
    goto joined_r0x001bacc2;
  }
  if ((0x100000001U >> (uVar3 & 0x3f) & 1) == 0) {
    if ((0x2000000020U >> (uVar3 & 0x3f) & 1) == 0) {
      if ((0x40000000400U >> (uVar3 & 0x3f) & 1) == 0) goto LAB_001bacb9;
LAB_001bac8c:
      cVar2 = val[1];
      if (cVar2 == '\0') {
        return true;
      }
      if ((((cVar2 == 'e') || (cVar2 == 'E')) && ((byte)(val[2] | 0x20U) == 0x73)) &&
         (val[3] == '\0')) {
        return true;
      }
      if (bVar1 != 0x74) {
        return false;
      }
    }
  }
  else {
    if (((byte)(val[1] | 0x20U) == 0x6e) && (val[2] == '\0')) {
      return true;
    }
    if (bVar1 != 0x54) {
      if (bVar1 != 0x59) {
        return false;
      }
      goto LAB_001bac8c;
    }
  }
  if ((byte)(val[1] | 0x20U) != 0x72) {
    return false;
  }
  if ((byte)(val[2] | 0x20U) != 0x75) {
    return false;
  }
  if ((byte)(val[3] | 0x20U) != 0x65) {
    return false;
  }
  cVar2 = val[4];
joined_r0x001bacc2:
  if (cVar2 != '\0') {
    return false;
  }
  return true;
}

Assistant:

bool cmSystemTools::IsOn(const char* val)
{
  if (!val) {
    return false;
  }
  /* clang-format off */
  // "1"
  if (val[0] == '1' && val[1] == '\0') {
    return true;
  }
  // "ON"
  if ((val[0] == 'O' || val[0] == 'o') &&
      (val[1] == 'N' || val[1] == 'n') && val[2] == '\0') {
    return true;
  }
  // "Y", "YES"
  if ((val[0] == 'Y' || val[0] == 'y') && (val[1] == '\0' || (
      (val[1] == 'E' || val[1] == 'e') &&
      (val[2] == 'S' || val[2] == 's') && val[3] == '\0'))) {
    return true;
  }
  // "TRUE"
  if ((val[0] == 'T' || val[0] == 't') &&
      (val[1] == 'R' || val[1] == 'r') &&
      (val[2] == 'U' || val[2] == 'u') &&
      (val[3] == 'E' || val[3] == 'e') && val[4] == '\0') {
    return true;
  }
  /* clang-format on */
  return false;
}